

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O0

void __thiscall TCPTransmitter::TCPTransmitter(TCPTransmitter *this,string *ipaddr,int port)

{
  string local_40 [36];
  int local_1c;
  string *psStack_18;
  int port_local;
  string *ipaddr_local;
  TCPTransmitter *this_local;
  
  local_1c = port;
  psStack_18 = ipaddr;
  ipaddr_local = (string *)this;
  Socket::Socket(&this->super_Socket,TCP);
  std::__cxx11::string::string(local_40,(string *)ipaddr);
  Socket::setRemoteSocket(&this->super_Socket,(string *)local_40,local_1c);
  std::__cxx11::string::~string(local_40);
  Socket::setNOSIGPIPE(&this->super_Socket);
  Socket::connectToRemote(&this->super_Socket);
  return;
}

Assistant:

TCPTransmitter::TCPTransmitter(const std::string ipaddr, int port) : Socket(Socket::type::TCP) {
  setRemoteSocket(ipaddr, port);
  setNOSIGPIPE();
  connectToRemote();
}